

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidAddress.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::SidAddress::~SidAddress(SidAddress *this)

{
  ~SidAddress(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

SidAddress::~SidAddress()
	{
	}